

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O2

void __thiscall
TPZDohrSubstruct<std::complex<long_double>_>::SolveSystemPhi
          (TPZDohrSubstruct<std::complex<long_double>_> *this)

{
  TPZFMatrix<std::complex<long_double>_> *this_00;
  ulong uVar1;
  complex<long_double> value;
  int iVar2;
  complex<long_double> *pcVar3;
  ulong row;
  ulong uVar4;
  long columns;
  TPZFMatrix<std::complex<long_double>_> Lambda_star;
  TPZFMatrix<std::complex<long_double>_> I_lambda;
  undefined8 local_168;
  undefined2 uStack_160;
  undefined6 uStack_15e;
  undefined8 local_158;
  undefined2 uStack_150;
  undefined6 uStack_14e;
  TPZFMatrix<std::complex<long_double>_> local_148;
  TPZFMatrix<std::complex<long_double>_> local_b8;
  
  uVar1 = (this->fCoarseIndex).fNElements;
  iVar2 = (int)uVar1;
  columns = (long)iVar2;
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix
            (&local_b8,
             (this->fNullPivots).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.
             fRow + columns,columns);
  row = 0;
  memset(local_b8.fElem,0,
         local_b8.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow *
         local_b8.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol * 0x20);
  local_b8.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  uVar4 = 0;
  if (0 < iVar2) {
    uVar4 = uVar1 & 0xffffffff;
  }
  for (; uVar4 != row; row = row + 1) {
    pcVar3 = TPZFMatrix<std::complex<long_double>_>::operator()(&local_b8,row,row);
    *(longdouble *)pcVar3->_M_value = (longdouble)1;
    *(longdouble *)(pcVar3->_M_value + 0x10) = (longdouble)0;
  }
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix
            (&local_148,
             (this->fNullPivots).super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.
             fRow + columns,columns);
  TPZStepSolver<std::complex<long_double>_>::Solve
            (&this->finv,&local_b8,&local_148,(TPZFMatrix<std::complex<long_double>_> *)0x0);
  this_00 = &this->fPhiC;
  TPZFMatrix<std::complex<long_double>_>::Resize(this_00,(long)this->fNEquations,columns);
  TPZMatrix<std::complex<long_double>_>::Multiply
            (&(this->fKeC_star).super_TPZMatrix<std::complex<long_double>_>,&local_148,this_00,0);
  local_168 = SUB108(-(longdouble)1,0);
  uStack_160 = (undefined2)((unkuint10)-(longdouble)1 >> 0x40);
  local_158 = SUB108((longdouble)0,0);
  uStack_150 = (undefined2)((unkuint10)(longdouble)0 >> 0x40);
  value._M_value._10_6_ = uStack_15e;
  value._M_value._8_2_ = uStack_160;
  value._M_value._26_6_ = uStack_14e;
  value._M_value._24_2_ = uStack_150;
  value._M_value._0_8_ = local_168;
  value._M_value._16_8_ = local_158;
  TPZFMatrix<std::complex<long_double>_>::operator*=(this_00,value);
  ComputeCoarseStiffness(this);
  TPZFMatrix<std::complex<long_double>_>::~TPZFMatrix(&local_148);
  TPZFMatrix<std::complex<long_double>_>::~TPZFMatrix(&local_b8);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::SolveSystemPhi() {
	int ncoarse = fCoarseIndex.NElements();
	int i;
	//  I_star.Print("fIStar = ",out,EMathematicaInput);
	//  std::cout << "Nci: ";
	//  std::cout << ncoarse;// << endl;
	//  std::cout << endl;
	//Constructing I_lambda
	TPZFMatrix<TVar> I_lambda(ncoarse+fNullPivots.Rows(),ncoarse);
	I_lambda.Zero();
	for (i=0;i<ncoarse;i++) {
		I_lambda(i,i)=1;
	}
	//  I_lambda.Print("ILambda = ",out,EMathematicaInput);
	
	//Obtaining lambda_star
	TPZFMatrix<TVar> Lambda_star(ncoarse+fNullPivots.Rows(),ncoarse);
	//  temp1->Print("temp1 = ",out,EMathematicaInput);
	//  out.flush();
	finv.Solve(I_lambda, Lambda_star);
	
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		Lambda_star.Print("matrix lambda star",sout );
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	//Obtaining Phi
	/** Acho q posso comentar essas duas linhas abaixo, pq naum tou vendo aplicacao pra temp2 */
	/*
	 TPZFMatrix<TVar> temp2(fNEquations,ncoarse);
	 C_star.MultAdd(Lambda_star,Lambda_star,temp2,-1,0,1,1);
	 */
	fPhiC.Resize(fNEquations,ncoarse);
	fKeC_star.Multiply(Lambda_star,fPhiC);
	fPhiC *= -1.;
	ComputeCoarseStiffness();
	//  fPhiC.Print("PhiC = ",out,EMathematicaInput);
	//  fC.Print("Ci = ",std::cout,EMathematicaInput);
}